

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O1

void __thiscall
CLIntercept::overrideNullLocalWorkSize
          (CLIntercept *this,cl_uint work_dim,size_t *global_work_size,size_t **param_3)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  undefined8 uVar5;
  float __x;
  float __x_00;
  
  if (*param_3 == (size_t *)0x0) {
    if (work_dim == 3) {
      uVar1 = (this->m_Config).NullLocalWorkSizeX;
      if (uVar1 == 0) {
        return;
      }
      uVar2 = (this->m_Config).NullLocalWorkSizeY;
      if (uVar2 == 0) {
        return;
      }
      uVar3 = (this->m_Config).NullLocalWorkSizeZ;
      if (uVar3 == 0) {
        return;
      }
      if (((*global_work_size % uVar1 != 0) || (global_work_size[1] % uVar2 != 0)) ||
         (global_work_size[2] % uVar3 != 0)) {
        iVar4 = pthread_mutex_lock((pthread_mutex_t *)&this->m_Mutex);
        if (iVar4 != 0) goto LAB_0017094a;
        logf(this,*(float *)&(this->m_Config).NullLocalWorkSizeY);
        goto LAB_0017092a;
      }
    }
    else if (work_dim == 2) {
      uVar1 = (this->m_Config).NullLocalWorkSizeX;
      if (uVar1 == 0) {
        return;
      }
      uVar2 = (this->m_Config).NullLocalWorkSizeY;
      if (uVar2 == 0) {
        return;
      }
      if ((*global_work_size % uVar1 != 0) || (global_work_size[1] % uVar2 != 0)) {
        iVar4 = pthread_mutex_lock((pthread_mutex_t *)&this->m_Mutex);
        if (iVar4 != 0) goto LAB_0017094a;
        logf(this,__x_00);
        goto LAB_0017092a;
      }
    }
    else {
      if (work_dim != 1) {
        return;
      }
      uVar1 = (this->m_Config).NullLocalWorkSizeX;
      if (uVar1 == 0) {
        return;
      }
      if (*global_work_size % uVar1 != 0) {
        iVar4 = pthread_mutex_lock((pthread_mutex_t *)&this->m_Mutex);
        if (iVar4 != 0) {
LAB_0017094a:
          uVar5 = std::__throw_system_error(iVar4);
          pthread_mutex_unlock((pthread_mutex_t *)&this->m_Mutex);
          _Unwind_Resume(uVar5);
        }
        logf(this,__x);
LAB_0017092a:
        pthread_mutex_unlock((pthread_mutex_t *)&this->m_Mutex);
        return;
      }
    }
    *param_3 = &(this->m_Config).NullLocalWorkSizeX;
  }
  return;
}

Assistant:

void CLIntercept::overrideNullLocalWorkSize(
    const cl_uint work_dim,
    const size_t* global_work_size,
    const size_t*& local_work_size )
{
    if( local_work_size == NULL )
    {
        switch( work_dim )
        {
        case 1:
            if( m_Config.NullLocalWorkSizeX != 0 )
            {
                if( global_work_size[0] % m_Config.NullLocalWorkSizeX == 0 )
                {
                    local_work_size = &m_Config.NullLocalWorkSizeX;
                }
                else
                {
                    std::lock_guard<std::mutex> lock(m_Mutex);
                    logf( "Couldn't override NULL local work size: < %zu > %% < %zu > != 0!\n",
                        global_work_size[0],
                        m_Config.NullLocalWorkSizeX );
                }
            }
            break;
        case 2:
            if( ( m_Config.NullLocalWorkSizeX != 0 ) &&
                ( m_Config.NullLocalWorkSizeY != 0 ) )
            {
                if( ( global_work_size[0] % m_Config.NullLocalWorkSizeX == 0 ) &&
                    ( global_work_size[1] % m_Config.NullLocalWorkSizeY == 0 ) )
                {
                    local_work_size = &m_Config.NullLocalWorkSizeX;
                }
                else
                {
                    std::lock_guard<std::mutex> lock(m_Mutex);
                    logf( "Couldn't override NULL local work size: < %zu x %zu > %% < %zu x %zu > != 0!\n",
                        global_work_size[0],
                        global_work_size[1],
                        m_Config.NullLocalWorkSizeX,
                        m_Config.NullLocalWorkSizeY );
                }
            }
            break;
        case 3:
            if( ( m_Config.NullLocalWorkSizeX != 0 ) &&
                ( m_Config.NullLocalWorkSizeY != 0 ) &&
                ( m_Config.NullLocalWorkSizeZ != 0 ) )
            {
                if( ( global_work_size[0] % m_Config.NullLocalWorkSizeX == 0 ) &&
                    ( global_work_size[1] % m_Config.NullLocalWorkSizeY == 0 ) &&
                    ( global_work_size[2] % m_Config.NullLocalWorkSizeZ == 0 ) )
                {
                    local_work_size = &m_Config.NullLocalWorkSizeX;
                }
                else
                {
                    std::lock_guard<std::mutex> lock(m_Mutex);
                    logf( "Couldn't override NULL local work size: < %zu x %zu x %zu > %% < %zu x %zu x %zu > != 0!\n",
                        global_work_size[0],
                        global_work_size[1],
                        global_work_size[2],
                        m_Config.NullLocalWorkSizeX,
                        m_Config.NullLocalWorkSizeY,
                        m_Config.NullLocalWorkSizeZ );
                }
            }
            break;
        default:
            // Nothing.
            break;
        }
    }
}